

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O2

void usrc_writeUCPTrie(FILE *f,char *name,UCPTrie *pTrie)

{
  char cVar1;
  long lStack_180;
  char line3 [100];
  char line2 [100];
  char line [100];
  
  cVar1 = pTrie->valueWidth;
  if (cVar1 == '\0') {
    lStack_180 = 0x10;
  }
  else if (cVar1 == '\x01') {
    lStack_180 = 0x20;
  }
  else {
    lStack_180 = (ulong)(cVar1 == '\x02') << 3;
  }
  sprintf(line,"static const uint16_t %s_trieIndex[%%ld]={\n",name);
  sprintf(line2,"static const uint%d_t %s_trieData[%%ld]={\n",lStack_180,name);
  usrc_writeUCPTrieArrays(f,line,line2,pTrie,"\n};\n\n");
  sprintf(line,"static const UCPTrie %s_trie={\n",name);
  sprintf(line2,"%s_trieIndex",name);
  sprintf(line3,"%s_trieData",name);
  usrc_writeUCPTrieStruct(f,line,pTrie,line2,line3,"};\n\n");
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeUCPTrie(FILE *f, const char *name, const UCPTrie *pTrie) {
    int32_t width=
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_16 ? 16 :
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_32 ? 32 :
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_8 ? 8 : 0;
    char line[100], line2[100], line3[100];
    sprintf(line, "static const uint16_t %s_trieIndex[%%ld]={\n", name);
    sprintf(line2, "static const uint%d_t %s_trieData[%%ld]={\n", (int)width, name);
    usrc_writeUCPTrieArrays(f, line, line2, pTrie, "\n};\n\n");
    sprintf(line, "static const UCPTrie %s_trie={\n", name);
    sprintf(line2, "%s_trieIndex", name);
    sprintf(line3, "%s_trieData", name);
    usrc_writeUCPTrieStruct(f, line, pTrie, line2, line3, "};\n\n");
}